

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

bool __thiscall
Rml::FontEffectGlow::GetGlyphMetrics
          (FontEffectGlow *this,Vector2i *origin,Vector2i *dimensions,FontGlyph *param_3)

{
  int iVar1;
  int iVar2;
  
  iVar2 = dimensions->y * dimensions->x;
  if (0 < iVar2) {
    iVar1 = this->combined_width;
    origin->x = origin->x + ((this->offset).x - iVar1);
    origin->y = origin->y + ((this->offset).y - iVar1);
    dimensions->x = dimensions->x + iVar1 * 2;
    dimensions->y = dimensions->y + iVar1 * 2;
  }
  return 0 < iVar2;
}

Assistant:

bool FontEffectGlow::GetGlyphMetrics(Vector2i& origin, Vector2i& dimensions, const FontGlyph& /*glyph*/) const
{
	if (dimensions.x * dimensions.y > 0)
	{
		origin.x += offset.x - combined_width;
		origin.y += offset.y - combined_width;

		dimensions.x += 2 * combined_width;
		dimensions.y += 2 * combined_width;

		return true;
	}

	return false;
}